

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x50 = 0x8668c8
  ;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x38 = 0x866940;
  this[-1].super_IfcLightSourcePositional.super_IfcLightSource.AmbientIntensity.ptr =
       4.35207012573404e-317;
  this[-1].super_IfcLightSourcePositional.super_IfcLightSource.Intensity.ptr = 4.35208988835987e-317
  ;
  puVar1 = *(undefined1 **)&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x80;
  puVar2 = &this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x90;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}